

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

uint32_t phf_round32(uchar *p,size_t n,uint32_t h1)

{
  uint uVar1;
  uint32_t uVar2;
  uint local_20;
  uint32_t local_1c;
  uint32_t k1;
  uint32_t h1_local;
  size_t n_local;
  uchar *p_local;
  
  local_1c = h1;
  n_local = (size_t)p;
  for (_k1 = n; 3 < _k1; _k1 = _k1 - 4) {
    local_1c = phf_round32((uint)*(byte *)n_local << 0x18 | (uint)*(byte *)(n_local + 1) << 0x10 |
                           (uint)*(byte *)(n_local + 2) << 8 | (uint)*(byte *)(n_local + 3),local_1c
                          );
    n_local = n_local + 4;
  }
  local_20 = 0;
  uVar1 = (uint)_k1 & 3;
  if (uVar1 != 1) {
    if (uVar1 != 2) {
      if (uVar1 != 3) {
        return local_1c;
      }
      local_20 = (uint)*(byte *)(n_local + 2) << 8;
    }
    local_20 = (uint)*(byte *)(n_local + 1) << 0x10 | local_20;
  }
  uVar2 = phf_round32((uint)*(byte *)n_local << 0x18 | local_20,local_1c);
  return uVar2;
}

Assistant:

static inline uint32_t phf_round32(const unsigned char *p, size_t n, uint32_t h1) {
	uint32_t k1;

	while (n >= 4) {
		k1 = (p[0] << 24)
		   | (p[1] << 16)
		   | (p[2] << 8)
		   | (p[3] << 0);

		h1 = phf_round32(k1, h1);

		p += 4;
		n -= 4;
	}

	k1 = 0;

	switch (n & 3) {
	case 3:
		k1 |= p[2] << 8;
	case 2:
		k1 |= p[1] << 16;
	case 1:
		k1 |= p[0] << 24;
		h1 = phf_round32(k1, h1);
	}

	return h1;
}